

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

db_bit * __thiscall lan::db::read_array_bit(db *this,string *name,string *content)

{
  int iVar1;
  db_bit *pdVar2;
  db_bit *pdVar3;
  logic_error *this_00;
  long *plVar4;
  size_type *psVar5;
  db *this_01;
  char *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pdVar2 = (db_bit *)operator_new(0x50);
  (pdVar2->key)._M_dataplus._M_p = (pointer)&(pdVar2->key).field_2;
  (pdVar2->key)._M_string_length = 0;
  (pdVar2->key).field_2._M_local_buf[0] = '\0';
  pdVar2->data = (void *)0x0;
  pdVar2->pre = (db_bit *)0x0;
  pdVar2->nex = (db_bit *)0x0;
  pdVar2->lin = (db_bit *)0x0;
  pdVar2->con = (db_bit *)0x0;
  std::__cxx11::string::_M_assign((string *)pdVar2);
  pdVar2->type = Array;
  pdVar2->data = (void *)0x0;
  pop_next(&local_b0,(db *)name,content);
  this_01 = (db *)0x10a180;
  iVar1 = std::__cxx11::string::compare((char *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    this_01 = (db *)(local_b0.field_2._M_allocated_capacity + 1);
    operator_delete(local_b0._M_dataplus._M_p,(ulong)this_01);
  }
  if (iVar1 == 0) {
    pdVar3 = get_array_data(this,content);
    pdVar2->lin = pdVar3;
    return pdVar2;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  pop_next(&local_90,this_01,content);
  std::operator+(&local_50,"LANDB (pull_error): landb: expected <[> before <",&local_90);
  this_02 = "> ... ";
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pop_next(&local_70,(db *)this_02,content);
  std::operator+(&local_b0,&local_d0,&local_70);
  std::logic_error::logic_error(this_00,(string *)&local_b0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

lan::db_bit * db::read_array_bit(std::string const name, std::string & content){
            db_bit * bit = new db_bit;
            bit->key = name;
            bit->type = Array;
            bit->data = nullptr;
            if(pop_next(content) != "[")
                throw lan::errors::pull_error ("LANDB (pull_error): landb: expected <[> before <" + pop_next(content) + "> ... " + pop_next(content));
            else
                bit->lin = get_array_data(content);
            return bit;
        }